

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# popt.c
# Opt level: O0

int poptStrippedArgv(poptContext con,int argc,char **argv)

{
  char *local_38;
  int local_2c;
  int local_28;
  int i;
  int j;
  int numargs;
  char **argv_local;
  int argc_local;
  poptContext con_local;
  
  local_28 = 1;
  i = argc;
  if (con->arg_strip != (pbm_set *)0x0) {
    for (local_2c = 1; local_2c < argc; local_2c = local_2c + 1) {
      if ((con->arg_strip[(ulong)(long)local_2c >> 5].bits[0] & 1 << ((byte)local_2c & 0x1f)) != 0)
      {
        i = i + -1;
      }
    }
  }
  for (local_2c = 1; local_2c < argc; local_2c = local_2c + 1) {
    if ((con->arg_strip == (pbm_set *)0x0) ||
       ((con->arg_strip[(ulong)(long)local_2c >> 5].bits[0] & 1 << ((byte)local_2c & 0x1f)) == 0)) {
      if (local_28 < i) {
        local_38 = argv[local_2c];
      }
      else {
        local_38 = (char *)0x0;
      }
      argv[local_28] = local_38;
      local_28 = local_28 + 1;
    }
  }
  return i;
}

Assistant:

int poptStrippedArgv(poptContext con, int argc, char ** argv)
{
    int numargs = argc;
    int j = 1;
    int i;
    
    if (con->arg_strip)
    for (i = 1; i < argc; i++) {
	if (PBM_ISSET(i, con->arg_strip))
	    numargs--;
    }
    
    for (i = 1; i < argc; i++) {
	if (con->arg_strip && PBM_ISSET(i, con->arg_strip))
	    continue;
	argv[j] = (j < numargs) ? argv[i] : NULL;
	j++;
    }
    
    return numargs;
}